

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O1

void Npn_ManWrite(Npn_Man_t *p,char *pFileName)

{
  int iVar1;
  ulong *Sign;
  int nSupp;
  uint uVar2;
  FILE *__stream;
  uint *__ptr;
  void *pvVar3;
  uint uVar4;
  long lVar5;
  size_t __nmemb;
  word *pwVar6;
  long lVar7;
  size_t sVar8;
  Npn_Obj_t *pNVar9;
  
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open NPN function file \"%s\".\n",pFileName);
    return;
  }
  uVar2 = p->nEntries;
  __ptr = (uint *)malloc(0x10);
  uVar4 = 8;
  if (6 < uVar2 - 1) {
    uVar4 = uVar2;
  }
  __ptr[1] = 0;
  *__ptr = uVar4;
  if (uVar4 == 0) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = malloc((long)(int)uVar4 << 3);
  }
  *(void **)(__ptr + 2) = pvVar3;
  if (0 < p->nBins) {
    lVar7 = 0;
    do {
      iVar1 = p->pBins[lVar7];
      if (p->nBufferSize <= iVar1) {
LAB_00283003:
        __assert_fail("i < p->nBufferSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                      ,0x31,"Npn_Obj_t *Npn_ManObj(Npn_Man_t *, int)");
      }
      if (iVar1 == 0) {
        pNVar9 = (Npn_Obj_t *)0x0;
      }
      else {
        pNVar9 = p->pBuffer + iVar1;
      }
      if (pNVar9 != (Npn_Obj_t *)0x0) {
        lVar5 = (long)(int)__ptr[1];
        uVar2 = *__ptr;
        pvVar3 = *(void **)(__ptr + 2);
        do {
          if ((uint)lVar5 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pvVar3 == (void *)0x0) {
                pvVar3 = malloc(0x80);
              }
              else {
                pvVar3 = realloc(pvVar3,0x80);
              }
              uVar2 = 0x10;
            }
            else {
              uVar4 = uVar2 * 2;
              if (SBORROW4(uVar2,uVar4) != 0 < (int)uVar2) {
                uVar2 = uVar4;
                if (pvVar3 == (void *)0x0) {
                  pvVar3 = malloc((ulong)uVar4 << 3);
                }
                else {
                  pvVar3 = realloc(pvVar3,(ulong)uVar4 << 3);
                }
              }
            }
          }
          *(Npn_Obj_t **)((long)pvVar3 + lVar5 * 8) = pNVar9;
          iVar1 = pNVar9->iNext;
          if (p->nBufferSize <= iVar1) {
            __ptr[1] = (uint)lVar5 + 1;
            *__ptr = uVar2;
            *(void **)(__ptr + 2) = pvVar3;
            goto LAB_00283003;
          }
          if (iVar1 == 0) {
            pNVar9 = (Npn_Obj_t *)0x0;
          }
          else {
            pNVar9 = p->pBuffer + iVar1;
          }
          lVar5 = lVar5 + 1;
        } while (pNVar9 != (Npn_Obj_t *)0x0);
        __ptr[1] = (uint)lVar5;
        *__ptr = uVar2;
        *(void **)(__ptr + 2) = pvVar3;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < p->nBins);
  }
  uVar2 = __ptr[1];
  __nmemb = (size_t)(int)uVar2;
  if (1 < (long)__nmemb) {
    qsort(*(void **)(__ptr + 2),__nmemb,8,Npn_ManCompareEntries);
  }
  if (0 < (int)uVar2) {
    lVar7 = *(long *)(__ptr + 2);
    sVar8 = 0;
    do {
      Sign = *(ulong **)(lVar7 + sVar8 * 8);
      Extra_PrintHexadecimal((FILE *)__stream,(uint *)Sign,6);
      pwVar6 = Truth;
      lVar5 = 0;
      uVar2 = 0;
      do {
        uVar2 = uVar2 + ((*pwVar6 & *Sign) >> ((byte)(1 << ((byte)lVar5 & 0x1f)) & 0x3f) !=
                        (~*pwVar6 & *Sign));
        lVar5 = lVar5 + 1;
        pwVar6 = pwVar6 + 1;
      } while (lVar5 != 6);
      fprintf(__stream," %d %d\n",(ulong)(uint)Sign[1],(ulong)uVar2);
      sVar8 = sVar8 + 1;
    } while (sVar8 != __nmemb);
  }
  fclose(__stream);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Npn_ManWrite( Npn_Man_t * p, char * pFileName )
{
    Vec_Ptr_t * vEntries;
    Npn_Obj_t * pEntry;
    FILE * pFile = fopen( pFileName, "w" );
    int i;
    if ( pFile == NULL )
    {
        Abc_Print( -1, "Cannot open NPN function file \"%s\".\n", pFileName );
        return;
    }
    vEntries = Vec_PtrAlloc( p->nEntries );
    for ( i = 0; i < p->nBins; i++ )
        for ( pEntry = Npn_ManObj(p, p->pBins[i]); pEntry; pEntry = Npn_ManObj(p, pEntry->iNext) )
            Vec_PtrPush( vEntries, pEntry );
    Vec_PtrSort( vEntries, (int (*)())Npn_ManCompareEntries );
    Vec_PtrForEachEntry( Npn_Obj_t *, vEntries, pEntry, i )
    {
        Extra_PrintHexadecimal( pFile, (unsigned *)&pEntry->uTruth, 6 );
        fprintf( pFile, " %d %d\n", pEntry->Count, Npn_TruthSuppSize(pEntry->uTruth, 6) );
    }
    fclose( pFile );
    Vec_PtrFree( vEntries );
}